

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O3

ecs_iter_t *
ecs_filter_iter(ecs_iter_t *__return_storage_ptr__,ecs_world_t *world,ecs_filter_t *filter)

{
  ecs_sparse_t *peVar1;
  ecs_type_t local_58;
  ecs_type_t peStack_50;
  undefined8 local_48;
  uint uStack_34;
  
  if (filter == (ecs_filter_t *)0x0) {
    local_58 = (ecs_type_t)0x0;
    peStack_50 = (ecs_type_t)0x0;
    local_48 = 0;
  }
  else {
    local_48._0_4_ = filter->include_kind;
    local_48._4_4_ = filter->exclude_kind;
    local_58 = filter->include;
    peStack_50 = filter->exclude;
  }
  peVar1 = (world->store).tables;
  __return_storage_ptr__->world = world;
  __return_storage_ptr__->real_world = (ecs_world_t *)0x0;
  __return_storage_ptr__->system = 0;
  __return_storage_ptr__->kind = EcsQuerySimpleIter;
  __return_storage_ptr__->table = (ecs_iter_table_t *)0x0;
  __return_storage_ptr__->query = (ecs_query_t *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->query + 4) = 0;
  __return_storage_ptr__->inactive_table_count = 0;
  __return_storage_ptr__->column_count = 0;
  __return_storage_ptr__->table_columns = (void *)0x0;
  __return_storage_ptr__->entities = (ecs_entity_t *)0x0;
  __return_storage_ptr__->param = (void *)0x0;
  __return_storage_ptr__->delta_time = 0.0;
  __return_storage_ptr__->delta_system_time = 0.0;
  __return_storage_ptr__->world_time = 0.0;
  __return_storage_ptr__->frame_offset = 0;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->count = 0;
  __return_storage_ptr__->total_count = 0;
  __return_storage_ptr__->triggered_by = (ecs_entities_t *)0x0;
  __return_storage_ptr__->interrupted_by = 0;
  (__return_storage_ptr__->iter).parent.filter.include = local_58;
  (__return_storage_ptr__->iter).parent.filter.exclude = peStack_50;
  *(undefined4 *)((long)&__return_storage_ptr__->iter + 0x10) = (undefined4)local_48;
  *(undefined4 *)((long)&__return_storage_ptr__->iter + 0x14) = local_48._4_4_;
  (__return_storage_ptr__->iter).parent.tables = (ecs_vector_t *)peVar1;
  (__return_storage_ptr__->iter).parent.index = 0;
  *(ulong *)((long)&__return_storage_ptr__->iter + 0x24) = (ulong)uStack_34;
  *(undefined8 *)((long)&(__return_storage_ptr__->iter).parent.table.columns + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->iter).parent.table.table + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->iter).parent.table.data + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->iter).parent.table.components + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->iter).parent.table.types + 4) = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->iter + 0x54) = 0;
  return __return_storage_ptr__;
}

Assistant:

ecs_iter_t ecs_filter_iter(
    ecs_world_t *world,
    const ecs_filter_t *filter)
{
    ecs_filter_iter_t iter = {
        .filter = filter ? *filter : (ecs_filter_t){0},
        .tables = world->store.tables,
        .index = 0
    };

    return (ecs_iter_t){
        .world = world,
        .iter.filter = iter
    };
}